

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media-adv.c
# Opt level: O1

la_proto_node * la_media_adv_parse(char *txt)

{
  char cVar1;
  long lVar2;
  byte bVar3;
  undefined1 *puVar4;
  la_proto_node *plVar5;
  size_t sVar6;
  void *pvVar7;
  ushort **ppuVar8;
  la_vstring *plVar9;
  byte bVar10;
  long lVar11;
  byte bVar12;
  char *pcVar13;
  
  if (txt == (char *)0x0) {
    plVar5 = (la_proto_node *)0x0;
  }
  else {
    puVar4 = (undefined1 *)
             la_xcalloc(1,0x38,
                        "/workspace/llm4binary/github/license_c_cmakelists/szpajder[P]libacars/libacars/media-adv.c"
                        ,0x33,"la_media_adv_parse");
    *puVar4 = 1;
    plVar5 = la_proto_node_new();
    plVar5->data = puVar4;
    plVar5->td = &la_DEF_media_adv_message;
    plVar5->next = (la_proto_node *)0x0;
    sVar6 = strlen(txt);
    if ((9 < sVar6) && (cVar1 = *txt, puVar4[1] = cVar1 + -0x30, (char)(cVar1 + -0x30) == '\0')) {
      cVar1 = txt[1];
      puVar4[5] = cVar1;
      if ((cVar1 == 'L') || (cVar1 == 'E')) {
        cVar1 = txt[2];
        puVar4[6] = cVar1;
        pvVar7 = memchr("VSHGC2XI",(int)cVar1,9);
        if (pvVar7 != (void *)0x0) {
          ppuVar8 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar8 + (long)txt[3] * 2 + 1) & 8) != 0) {
            lVar2 = 0;
            do {
              lVar11 = lVar2;
              if (lVar11 == 5) goto LAB_001541e5;
              lVar2 = lVar11 + 1;
            } while ((*(byte *)((long)*ppuVar8 + (long)txt[lVar11 + 4] * 2 + 1) & 8) != 0);
            if (7 < lVar11 + 3U) {
LAB_001541e5:
              bVar12 = (txt[3] * '\n' + txt[4]) - 0x10;
              puVar4[2] = bVar12;
              bVar3 = (txt[5] * '\n' + txt[6]) - 0x10;
              puVar4[3] = bVar3;
              bVar10 = (txt[7] * '\n' + txt[8]) - 0x10;
              puVar4[4] = bVar10;
              if ((bVar12 < 0x18) && (bVar10 < 0x3c && bVar3 < 0x3c)) {
                plVar9 = la_vstring_new();
                *(la_vstring **)(puVar4 + 8) = plVar9;
                for (pcVar13 = txt + 10; cVar1 = pcVar13[-1], cVar1 != '\0'; pcVar13 = pcVar13 + 1)
                {
                  if (cVar1 == '/') {
                    if (*pcVar13 != '\0') {
                      pcVar13 = strdup(pcVar13);
                      *(char **)(puVar4 + 0x10) = pcVar13;
                    }
                    break;
                  }
                  pvVar7 = memchr("VSHGC2XI",(int)cVar1,9);
                  if (pvVar7 == (void *)0x0) {
                    return plVar5;
                  }
                  la_vstring_append_buffer(*(la_vstring **)(puVar4 + 8),pcVar13 + -1,1);
                }
                *puVar4 = 0;
              }
            }
          }
        }
      }
    }
  }
  return plVar5;
}

Assistant:

la_proto_node *la_media_adv_parse(char const *txt) {
	if(txt == NULL) {
		return NULL;
	}

	LA_NEW(la_media_adv_msg, msg);
	msg->err = true;

	la_proto_node *node = la_proto_node_new();
	node->data = msg;
	node->td = &la_DEF_media_adv_message;
	node->next = NULL;

	if(strlen(txt) < 10) {
		goto end;
	}
	msg->version = txt[0] - '0';
	if(msg->version != 0) {
		goto end;
	}
	msg->state = txt[1];
	if(msg->state != 'E' && msg->state != 'L') {
		goto end;
	}
	msg->current_link = txt[2];
	if(!is_valid_link(msg->current_link)) {
		goto end;
	}
	for(size_t i = 3; i < 9; i++) {
		if(!isdigit(txt[i])) {
			goto end;
		}
	}
	msg->hour = ATOI2(txt[3], txt[4]);
	msg->minute = ATOI2(txt[5], txt[6]);
	msg->second = ATOI2(txt[7], txt[8]);
	if(msg->hour > 23 || msg->minute > 59 || msg->second > 59) {
		goto end;
	}
	txt += 9;
	msg->available_links = la_vstring_new();
	// Copy all link until / character or end of string
	for(; *txt != '/' && *txt != '\0'; txt++) {
		if(is_valid_link(*txt)) {
			la_vstring_append_buffer(msg->available_links, txt, 1);
		} else {
			goto end;
		}
	}
	if(txt[0] == '/' && txt[1] != '\0') {
		msg->text = strdup(txt + 1);
	}
	msg->err = false;
end:
	return node;
}